

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<spirv_cross::Resource,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
          (SmallVector<spirv_cross::Resource,_8UL> *this,
          SmallVector<spirv_cross::Resource,_8UL> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Resource *pRVar3;
  undefined8 *puVar4;
  void *pvVar5;
  size_t sVar6;
  undefined8 uVar7;
  Resource *pRVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  clear(this);
  pRVar8 = (other->super_VectorView<spirv_cross::Resource>).ptr;
  if (pRVar8 == (Resource *)&other->stack_storage) {
    reserve(this,(other->super_VectorView<spirv_cross::Resource>).buffer_size);
    if ((other->super_VectorView<spirv_cross::Resource>).buffer_size == 0) {
      uVar9 = 0;
    }
    else {
      lVar11 = 0x20;
      uVar10 = 0;
      do {
        pRVar8 = (this->super_VectorView<spirv_cross::Resource>).ptr;
        puVar1 = (undefined8 *)((long)&(pRVar8->id).id + lVar11);
        pRVar3 = (other->super_VectorView<spirv_cross::Resource>).ptr;
        puVar2 = (undefined8 *)((long)&(pRVar3->id).id + lVar11);
        *(undefined4 *)((long)pRVar8 + lVar11 + -0x18) =
             *(undefined4 *)((long)pRVar3 + lVar11 + -0x18);
        *(undefined8 *)((long)pRVar8 + lVar11 + -0x20) =
             *(undefined8 *)((long)pRVar3 + lVar11 + -0x20);
        *(undefined8 **)((long)pRVar8 + lVar11 + -0x10) = puVar1;
        puVar4 = *(undefined8 **)((long)pRVar3 + lVar11 + -0x10);
        if (puVar2 == puVar4) {
          uVar7 = puVar2[1];
          *puVar1 = *puVar2;
          puVar1[1] = uVar7;
        }
        else {
          *(undefined8 **)((long)pRVar8 + lVar11 + -0x10) = puVar4;
          *(undefined8 *)((long)&(pRVar8->id).id + lVar11) = *puVar2;
        }
        *(undefined8 *)((long)pRVar8 + lVar11 + -8) = *(undefined8 *)((long)pRVar3 + lVar11 + -8);
        *(undefined8 **)((long)pRVar3 + lVar11 + -0x10) = puVar2;
        *(undefined8 *)((long)pRVar3 + lVar11 + -8) = 0;
        *(undefined1 *)((long)&(pRVar3->id).id + lVar11) = 0;
        pRVar8 = (other->super_VectorView<spirv_cross::Resource>).ptr;
        pvVar5 = *(void **)((long)pRVar8 + lVar11 + -0x10);
        if ((void *)((long)&(pRVar8->id).id + lVar11) != pvVar5) {
          operator_delete(pvVar5);
        }
        uVar10 = uVar10 + 1;
        uVar9 = (other->super_VectorView<spirv_cross::Resource>).buffer_size;
        lVar11 = lVar11 + 0x30;
      } while (uVar10 < uVar9);
    }
    (this->super_VectorView<spirv_cross::Resource>).buffer_size = uVar9;
    (other->super_VectorView<spirv_cross::Resource>).buffer_size = 0;
  }
  else {
    pRVar3 = (this->super_VectorView<spirv_cross::Resource>).ptr;
    if (pRVar3 != (Resource *)&this->stack_storage) {
      free(pRVar3);
      pRVar8 = (other->super_VectorView<spirv_cross::Resource>).ptr;
    }
    (this->super_VectorView<spirv_cross::Resource>).ptr = pRVar8;
    sVar6 = other->buffer_capacity;
    (this->super_VectorView<spirv_cross::Resource>).buffer_size =
         (other->super_VectorView<spirv_cross::Resource>).buffer_size;
    this->buffer_capacity = sVar6;
    (other->super_VectorView<spirv_cross::Resource>).ptr = (Resource *)0x0;
    (other->super_VectorView<spirv_cross::Resource>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}